

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  EnumValueDescriptor *enum_value;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *proto_00;
  int i;
  int index;
  
  if ((descriptor->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
    DescriptorBuilder::
    ValidateNamingStyle<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
              (*(DescriptorBuilder **)this,descriptor,proto);
  }
  for (index = 0; index < descriptor->value_count_; index = index + 1) {
    enum_value = EnumDescriptor::value(descriptor,index);
    proto_00 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                         (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,index);
    if ((enum_value->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
      DescriptorBuilder::
      ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>
                (*(DescriptorBuilder **)this,enum_value,proto_00);
    }
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }